

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

CNetMessage * __thiscall
V1Transport::GetReceivedMessage(V1Transport *this,microseconds time,bool *reject_message)

{
  string_view str;
  string_view str_00;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined1 uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint256 *puVar4;
  uchar *puVar5;
  int *piVar6;
  undefined1 *in_RCX;
  size_t sVar7;
  rep in_RDX;
  long in_RSI;
  CNetMessage *in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var8;
  CNetMessage *msg;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock38;
  uint256 hash;
  undefined4 in_stack_fffffffffffffd68;
  uint32_t in_stack_fffffffffffffd6c;
  uint256 *in_stack_fffffffffffffd70;
  V1Transport *in_stack_fffffffffffffd78;
  CMessageHeader *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  CNetMessage *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffda0;
  CMessageHeader *in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdb4;
  undefined4 uVar9;
  int rule;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  int source_line;
  ConstevalFormatString<5U> fmt;
  string_view in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe30;
  char *pcVar10;
  char *in_stack_fffffffffffffe38;
  Level in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  uint *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  Transport in_stack_ffffffffffffff38;
  long *in_stack_ffffffffffffff40;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar7 = in_RSI + 0x18;
  fmt.fmt = (char *)in_RDI;
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd6c,(Mutex *)0x207f53);
  *in_RCX = 0;
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffda8,
             in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
             (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd88 >> 0x18,0));
  CNetMessage::CNetMessage(in_stack_fffffffffffffd90,(DataStream *)in_stack_fffffffffffffd88);
  CMessageHeader::GetCommand_abi_cxx11_(in_stack_fffffffffffffda8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffdc8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  (((CNetMessage *)fmt.fmt)->m_time).__r = in_RDX;
  ((CNetMessage *)fmt.fmt)->m_message_size = *(uint32_t *)(in_RSI + 0x100);
  ((CNetMessage *)fmt.fmt)->m_raw_message_size = *(int *)(in_RSI + 0x100) + 0x18;
  puVar4 = GetMessageHash(in_stack_fffffffffffffd78);
  local_48 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
  uStack_40 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
  local_38 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
  uStack_30 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
  puVar5 = base_blob<256U>::begin
                     ((base_blob<256U> *)
                      CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  source_line = (int)((ulong)puVar5 >> 0x20);
  uVar3 = ReadLE32((uchar *)in_stack_fffffffffffffd70);
  RandAddEvent(in_stack_fffffffffffffd6c);
  piVar6 = (int *)base_blob<256U>::begin
                            ((base_blob<256U> *)
                             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  if (*piVar6 == *(int *)(in_RSI + 0x104)) {
    bVar2 = CMessageHeader::IsCommandValid(in_stack_fffffffffffffd80);
    uVar9 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffdb4);
    if (!bVar2) {
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                                  Trace);
      rule = CONCAT13((char)((uint)uVar9 >> 0x18),CONCAT12(bVar2,(short)uVar9));
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd88,
                   (char *)in_stack_fffffffffffffd80);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd88,
                   (char *)in_stack_fffffffffffffd80);
        pcVar10 = "Header error: Invalid message type (%s, %u bytes), peer=%d\n";
        CMessageHeader::GetCommand_abi_cxx11_(in_stack_fffffffffffffda8);
        _Var8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd88);
        str_00._M_len._7_1_ = in_stack_fffffffffffffdc7;
        str_00._M_len._0_7_ = in_stack_fffffffffffffdc0;
        str_00._M_str = (char *)piVar6;
        SanitizeString_abi_cxx11_(str_00,rule);
        in_stack_fffffffffffffd78 = (V1Transport *)&stack0xffffffffffffff38;
        in_stack_fffffffffffffd68 = 1;
        logging_function_00._M_str = in_stack_fffffffffffffe38;
        logging_function_00._M_len = (size_t)pcVar10;
        LogPrintFormatInternal<std::__cxx11::string,unsigned_int,long>
                  (logging_function_00,_Var8,source_line,CONCAT44(uVar3,in_stack_fffffffffffffdd0),
                   in_stack_ffffffffffffff10,(ConstevalFormatString<3U>)fmt.fmt,
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                   (long *)in_stack_ffffffffffffff30);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      }
      *in_RCX = 1;
    }
  }
  else {
    uVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),Trace)
    ;
    if ((bool)uVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd88,
                 (char *)in_stack_fffffffffffffd80);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd88,
                 (char *)in_stack_fffffffffffffd80);
      _Var8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd88);
      pcVar10 = (char *)_Var8._M_len;
      str._M_len._7_1_ = uVar1;
      str._M_len._0_7_ = in_stack_fffffffffffffdc0;
      str._M_str = (char *)piVar6;
      SanitizeString_abi_cxx11_(str,in_stack_fffffffffffffdb4);
      Span<unsigned_char>::Span<uint256>
                ((Span<unsigned_char> *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                 (type)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      Span<unsigned_char>::first
                ((Span<unsigned_char> *)in_stack_fffffffffffffd78,(size_t)in_stack_fffffffffffffd70)
      ;
      Span<const_unsigned_char>::Span<unsigned_char,_0>
                ((Span<const_unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                 (Span<unsigned_char> *)0x2081cd);
      s.m_size = sVar7;
      s.m_data = (uchar *)in_RDI;
      HexStr_abi_cxx11_(s);
      Span<const_unsigned_char>::Span<4>
                ((Span<const_unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                 (uchar (*) [4])0x208208);
      s_00.m_size = sVar7;
      s_00.m_data = (uchar *)in_RDI;
      HexStr_abi_cxx11_(s_00);
      in_stack_fffffffffffffd78 = (V1Transport *)&stack0xffffffffffffff98;
      in_stack_fffffffffffffd68 = 1;
      logging_function._M_str = pcVar10;
      logging_function._M_len = in_stack_fffffffffffffe30;
      LogPrintFormatInternal<std::__cxx11::string,unsigned_int,std::__cxx11::string,std::__cxx11::string,long>
                (logging_function,in_stack_fffffffffffffe20,source_line,
                 CONCAT44(uVar3,in_stack_fffffffffffffdd0),in_stack_ffffffffffffff10,fmt,
                 in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff38._vptr_Transport,in_stack_ffffffffffffff40);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    }
    *in_RCX = 1;
  }
  Reset(in_stack_fffffffffffffd78);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CNetMessage V1Transport::GetReceivedMessage(const std::chrono::microseconds time, bool& reject_message)
{
    AssertLockNotHeld(m_recv_mutex);
    // Initialize out parameter
    reject_message = false;
    // decompose a single CNetMessage from the TransportDeserializer
    LOCK(m_recv_mutex);
    CNetMessage msg(std::move(vRecv));

    // store message type string, time, and sizes
    msg.m_type = hdr.GetCommand();
    msg.m_time = time;
    msg.m_message_size = hdr.nMessageSize;
    msg.m_raw_message_size = hdr.nMessageSize + CMessageHeader::HEADER_SIZE;

    uint256 hash = GetMessageHash();

    // We just received a message off the wire, harvest entropy from the time (and the message checksum)
    RandAddEvent(ReadLE32(hash.begin()));

    // Check checksum and header message type string
    if (memcmp(hash.begin(), hdr.pchChecksum, CMessageHeader::CHECKSUM_SIZE) != 0) {
        LogDebug(BCLog::NET, "Header error: Wrong checksum (%s, %u bytes), expected %s was %s, peer=%d\n",
                 SanitizeString(msg.m_type), msg.m_message_size,
                 HexStr(Span{hash}.first(CMessageHeader::CHECKSUM_SIZE)),
                 HexStr(hdr.pchChecksum),
                 m_node_id);
        reject_message = true;
    } else if (!hdr.IsCommandValid()) {
        LogDebug(BCLog::NET, "Header error: Invalid message type (%s, %u bytes), peer=%d\n",
                 SanitizeString(hdr.GetCommand()), msg.m_message_size, m_node_id);
        reject_message = true;
    }

    // Always reset the network deserializer (prepare for the next message)
    Reset();
    return msg;
}